

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O3

void __thiscall
CPP::WriteInitialization::Item::addSetter
          (Item *this,QString *setter,QString *directive,bool translatable)

{
  char16_t *pcVar1;
  ItemData *pIVar2;
  undefined3 in_register_00000009;
  TemporaryVariableGeneratorPolicy TVar3;
  long in_FS_OFFSET;
  QHashDummyValue local_2a;
  QHashDummyValue local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (directive->d).ptr;
  TVar3 = (pcVar1 == (char16_t *)0x0) + GenerateWithMultiDirective;
  if (CONCAT31(in_register_00000009,translatable) == 0) {
    QMultiMap<QString,_QString>::insert((QMultiMap<QString,_QString> *)this,directive,setter);
    if (pcVar1 != (char16_t *)0x0) {
      QHash<QString,QHashDummyValue>::emplace<QHashDummyValue_const&>
                ((QHash<QString,QHashDummyValue> *)&(this->m_setupUiData).directives,directive,
                 &local_29);
    }
    if ((int)TVar3 <= (int)(this->m_setupUiData).policy) goto LAB_0013111f;
    pIVar2 = &this->m_setupUiData;
  }
  else {
    QMultiMap<QString,_QString>::insert(&(this->m_retranslateUiData).setters,directive,setter);
    if (pcVar1 != (char16_t *)0x0) {
      QHash<QString,QHashDummyValue>::emplace<QHashDummyValue_const&>
                ((QHash<QString,QHashDummyValue> *)&(this->m_retranslateUiData).directives,directive
                 ,&local_2a);
    }
    if ((int)TVar3 <= (int)(this->m_retranslateUiData).policy) goto LAB_0013111f;
    pIVar2 = &this->m_retranslateUiData;
  }
  pIVar2->policy = TVar3;
LAB_0013111f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteInitialization::Item::addSetter(const QString &setter, const QString &directive, bool translatable)
{
    const ItemData::TemporaryVariableGeneratorPolicy newPolicy = directive.isNull() ? ItemData::Generate : ItemData::GenerateWithMultiDirective;
    if (translatable) {
        m_retranslateUiData.setters.insert(directive, setter);
        if (ItemData::GenerateWithMultiDirective == newPolicy)
            m_retranslateUiData.directives << directive;
        if (m_retranslateUiData.policy < newPolicy)
            m_retranslateUiData.policy = newPolicy;
    } else {
        m_setupUiData.setters.insert(directive, setter);
        if (ItemData::GenerateWithMultiDirective == newPolicy)
            m_setupUiData.directives << directive;
        if (m_setupUiData.policy < newPolicy)
            m_setupUiData.policy = newPolicy;
    }
}